

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeCheckFk(Vdbe *p,int deferred)

{
  sqlite3 *db;
  int deferred_local;
  Vdbe *p_local;
  
  if (((deferred == 0) || (p->db->nDeferredCons < 1)) && ((deferred != 0 || (p->nFkConstraint < 1)))
     ) {
    p_local._4_4_ = 0;
  }
  else {
    p->rc = 0x313;
    p->errorAction = '\x02';
    sqlite3SetString(&p->zErrMsg,p->db,"foreign key constraint failed");
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeCheckFk(Vdbe *p, int deferred){
  sqlite3 *db = p->db;
  if( (deferred && db->nDeferredCons>0) || (!deferred && p->nFkConstraint>0) ){
    p->rc = SQLITE_CONSTRAINT_FOREIGNKEY;
    p->errorAction = OE_Abort;
    sqlite3SetString(&p->zErrMsg, db, "foreign key constraint failed");
    return SQLITE_ERROR;
  }
  return SQLITE_OK;
}